

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O2

Result * __thiscall
CoreML::OneHotEncoder::getFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<long,_std::allocator<long>_> *container)

{
  int64_t in_RAX;
  OneHotEncoder *pOVar1;
  int i;
  int index;
  undefined1 *this_00;
  int64_t local_38;
  
  local_38 = in_RAX;
  pOVar1 = Specification::Model::_internal_mutable_onehotencoder
                     ((this->super_Model).m_spec.
                      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  index = 0;
  while( true ) {
    this_00 = Specification::_Int64Vector_default_instance_;
    if (pOVar1->_oneof_case_[0] == 2) {
      this_00 = (undefined1 *)(pOVar1->CategoryType_).int64categories_;
    }
    if ((((Int64Vector *)this_00)->vector_).current_size_ <= index) break;
    local_38 = Specification::Int64Vector::_internal_vector((Int64Vector *)this_00,index);
    std::vector<long,_std::allocator<long>_>::emplace_back<long>(container,&local_38);
    index = index + 1;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::getFeatureEncoding(std::vector<int64_t>& container) {
        auto *ohe = m_spec->mutable_onehotencoder();
        
        for (int i = 0; i < ohe->int64categories().vector_size(); i++) {
            container.push_back(ohe->int64categories().vector(i));
        }
        return Result();
    }